

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.h
# Opt level: O2

int __thiscall imrt::Station::get_sum_alpha(Station *this,string *strategy)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  int iVar5;
  int i;
  long lVar6;
  int j;
  long lVar7;
  
  bVar2 = std::operator==(strategy,"dao_ls");
  if (bVar2) {
    iVar5 = 0;
    for (pdVar4 = (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar4 != (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish; pdVar4 = pdVar4 + 1) {
      iVar5 = (int)((double)iVar5 + *pdVar4);
    }
  }
  else {
    bVar2 = std::operator==(strategy,"ibo_ls");
    iVar5 = 0;
    if (bVar2) {
      lVar6 = 0;
      iVar5 = 0;
      while( true ) {
        iVar3 = Collimator::getXdim(this->collimator);
        if (iVar3 <= lVar6) break;
        lVar7 = 0;
        while( true ) {
          iVar3 = Collimator::getYdim(this->collimator);
          if (iVar3 <= lVar7) break;
          dVar1 = (this->I).p[lVar6][lVar7];
          if ((double)iVar5 < dVar1) {
            iVar5 = (int)dVar1;
          }
          lVar7 = lVar7 + 1;
        }
        lVar6 = lVar6 + 1;
      }
    }
  }
  return iVar5;
}

Assistant:

int get_sum_alpha(string strategy) const{
    int intens=0;
    if(strategy=="dao_ls"){
      for(auto i:intensity) intens+=i;
      return (intens);
    }else if(strategy=="ibo_ls"){
	    for (int i=0; i<collimator.getXdim();i++)
		    for (int j=0; j<collimator.getYdim(); j++)
          if(I(i,j)>intens) intens=I(i,j);
      return (intens);
    }
    return(intens);
  }